

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenInitializer::AddToSourceGroup
          (cmQtAutoGenInitializer *this,string *fileName,string_view genNameUpper)

{
  cmState *this_00;
  cmValue cVar1;
  cmSourceGroup *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  long *plVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view text;
  string groupName;
  string property;
  string local_108;
  undefined1 *local_e8;
  long *local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  string *local_c8;
  string local_c0;
  string local_a0;
  undefined1 local_80 [32];
  long *local_60 [2];
  long local_50;
  char *local_48;
  size_type local_40;
  pointer local_38;
  
  local_e8 = &local_d8;
  local_e0 = (long *)0x0;
  local_d8 = 0;
  paVar2 = &local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_a0.field_2._M_allocated_capacity = 0xd;
  local_a0.field_2._8_8_ = (long)"AUTOGEN_SOURCE_GROUP" + 7;
  views._M_len = 2;
  views._M_array = (iterator)&local_a0;
  local_108._M_dataplus._M_p = (pointer)paVar2;
  local_c8 = fileName;
  local_a0._M_dataplus._M_p = (pointer)genNameUpper._M_len;
  local_a0._M_string_length = (size_type)genNameUpper._M_str;
  cmCatViews_abi_cxx11_((string *)local_80,views);
  local_60[0] = &local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"AUTOGEN_SOURCE_GROUP","");
  lVar3 = 0;
  do {
    this_00 = cmMakefile::GetState(this->Makefile);
    cVar1 = cmState::GetGlobalProperty(this_00,(string *)(local_80 + lVar3));
    if ((cVar1.Value != (string *)0x0) && ((cVar1.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&local_108);
      std::__cxx11::string::_M_assign((string *)&local_e8);
      break;
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x40);
  lVar3 = -0x40;
  plVar4 = &local_50;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  if ((cmQtAutoGen *)local_108._M_string_length != (cmQtAutoGen *)0x0) {
    this_01 = cmMakefile::GetOrCreateSourceGroup(this->Makefile,&local_108);
    if (this_01 != (cmSourceGroup *)0x0) goto LAB_002c5b42;
    text._M_str = (char *)paVar2;
    text._M_len = (size_t)local_108._M_dataplus._M_p;
    cmQtAutoGen::Quoted_abi_cxx11_(&local_c0,(cmQtAutoGen *)local_108._M_string_length,text);
    local_80._16_8_ = 10;
    local_80._24_8_ = " error in ";
    local_60[0] = local_e0;
    local_60[1] = (long *)local_e8;
    local_50 = 0x2c;
    local_48 = ": Could not find or create the source group ";
    local_40 = local_c0._M_string_length;
    local_38 = local_c0._M_dataplus._M_p;
    views_00._M_len = 5;
    views_00._M_array = (iterator)local_80;
    local_80._0_8_ = (pointer)genNameUpper._M_len;
    local_80._8_8_ = genNameUpper._M_str;
    cmCatViews_abi_cxx11_(&local_a0,views_00);
    cmSystemTools::Error(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = (cmSourceGroup *)0x0;
LAB_002c5b42:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
  }
  if (this_01 != (cmSourceGroup *)0x0) {
    cmSourceGroup::AddGroupFile(this_01,local_c8);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddToSourceGroup(std::string const& fileName,
                                              cm::string_view genNameUpper)
{
  cmSourceGroup* sourceGroup = nullptr;
  // Acquire source group
  {
    std::string property;
    std::string groupName;
    {
      // Prefer generator specific source group name
      std::initializer_list<std::string> const props{
        cmStrCat(genNameUpper, "_SOURCE_GROUP"), "AUTOGEN_SOURCE_GROUP"
      };
      for (std::string const& prop : props) {
        cmValue propName = this->Makefile->GetState()->GetGlobalProperty(prop);
        if (cmNonempty(propName)) {
          groupName = *propName;
          property = prop;
          break;
        }
      }
    }
    // Generate a source group on demand
    if (!groupName.empty()) {
      sourceGroup = this->Makefile->GetOrCreateSourceGroup(groupName);
      if (!sourceGroup) {
        cmSystemTools::Error(
          cmStrCat(genNameUpper, " error in ", property,
                   ": Could not find or create the source group ",
                   cmQtAutoGen::Quoted(groupName)));
      }
    }
  }
  if (sourceGroup) {
    sourceGroup->AddGroupFile(fileName);
  }
}